

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWithConstantOnLeft(OptimizeInstructions *this,Binary *curr)

{
  BinaryOp BVar1;
  Expression *pEVar2;
  bool bVar3;
  BinaryOp BVar4;
  int64_t iVar5;
  Binary *pBVar6;
  uintptr_t uVar7;
  Literal *this_00;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_268;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_228;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  *local_218;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  *local_210;
  anon_union_16_5_9943fe1e_for_Literal_0 local_200;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  undefined8 local_1e0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1d8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1a8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_178;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_148;
  char local_117;
  char local_115;
  char local_113;
  char local_111;
  char local_110;
  char local_10e;
  char local_10d;
  char local_f8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_f0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_c0;
  Expression *local_90;
  Expression *right;
  undefined1 local_80 [24];
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_68;
  uintptr_t local_58;
  Expression *local_50;
  HeapType local_48;
  Const *c1;
  Const *c2;
  Expression *x;
  
  pEVar2 = curr->left;
  if (pEVar2->_id != ConstId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,"T *wasm::Expression::cast() [T = wasm::Const]");
  }
  uVar7 = (pEVar2->type).id;
  local_58 = uVar7;
  if ((((ulong)curr->op < 0x28) && ((0xf800007c00U >> ((ulong)curr->op & 0x3f) & 1) != 0)) &&
     (bVar3 = Literal::isZero((Literal *)(pEVar2 + 1)), bVar3)) {
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)&local_200.func,
               &((this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule,curr->right);
    bVar3 = false;
    if (((local_110 == '\0') &&
        (bVar3 = false, local_1a8._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
       ((bVar3 = false, local_f8 == '\0' &&
        (local_148._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
      if (((local_117 == '\0') && (local_115 == '\0')) &&
         ((local_113 == '\0' &&
          (((local_111 == '\0' && (local_10e == '\0')) && (local_1e0._5_1_ == '\0')))))) {
        bVar3 = false;
        if ((local_10d == '\0') && (local_c0._M_impl.super__Rb_tree_header._M_node_count == 0)) {
          if (local_1e0._4_1_ != '\0') goto LAB_007fb008;
          bVar3 = local_f0._M_impl.super__Rb_tree_header._M_node_count == 0;
        }
      }
      else {
LAB_007fb008:
        bVar3 = false;
      }
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_c0);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_f0);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_148);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_178);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1a8);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1d8);
    if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0);
    }
    uVar7 = local_58;
    if (!bVar3) goto LAB_007fb072;
LAB_007fb1a7:
    pBVar6 = (Binary *)curr->left;
  }
  else {
LAB_007fb072:
    if (6 < uVar7) {
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                    ,0xc6,"BasicType wasm::Type::getBasic() const");
    }
    BVar1 = curr->op;
    if (((BVar1 == *(BinaryOp *)(&DAT_00b7be14 + uVar7 * 4)) ||
        (BVar1 == *(BinaryOp *)(&DAT_00b7bcb0 + uVar7 * 4))) ||
       (BVar1 == *(BinaryOp *)(&DAT_00b7bccc + uVar7 * 4))) {
      iVar5 = Literal::getInteger((Literal *)(pEVar2 + 1));
      if (iVar5 == -1) {
        local_1e0._4_2_ = local_1e0._5_2_;
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)&local_200.func,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).super_Pass.runner)->options,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currModule,curr->right);
        bVar3 = false;
        if ((((local_110 == '\0') &&
             (bVar3 = false, local_1a8._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
            (bVar3 = false, local_f8 == '\0')) &&
           (local_148._M_impl.super__Rb_tree_header._M_node_count == 0)) {
          if (((local_117 == '\0') && (local_115 == '\0')) &&
             (((local_113 == '\0' && ((local_111 == '\0' && (local_10e == '\0')))) &&
              (local_1e0._5_1_ == '\0')))) {
            bVar3 = false;
            if ((local_10d == '\0') && (local_c0._M_impl.super__Rb_tree_header._M_node_count == 0))
            {
              if (local_1e0._4_1_ != '\0') goto LAB_007fb146;
              bVar3 = local_f0._M_impl.super__Rb_tree_header._M_node_count == 0;
            }
          }
          else {
LAB_007fb146:
            bVar3 = false;
          }
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_c0);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_f0);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_148);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_178);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_1a8);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_1d8);
        if (local_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0);
        }
        if (bVar3) goto LAB_007fb1a7;
      }
    }
    local_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e0 = 0;
    local_200.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_48;
    local_90 = (Expression *)&c2;
    local_218 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                 *)&local_90;
    local_268.submatchers.curr =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
          *)0x0;
    local_268.submatchers.next._8_8_ = 0;
    local_268.binder =
         (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
          *)&c1;
    local_228.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
    local_228._8_4_ = 3;
    local_80._0_8_ =
         (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_> *)
         0x0;
    local_80._8_4_ = Sub;
    local_50 = pEVar2;
    pBVar6 = curr;
    if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
          BinaryId) &&
        (BVar1 = curr->op, local_210 = &local_268, local_80._16_8_ = &local_200,
        local_68 = &local_228, BVar4 = Abstract::getBinary((Type)(curr->left->type).id,Sub),
        BVar1 == BVar4)) &&
       (bVar3 = Match::Internal::
                Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
                ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
                              *)(local_80 + 0x10)), bVar3)) {
      Literal::sub((Literal *)&local_200.func,(Literal *)(local_48.id + 0x10),&c1->value);
      Literal::operator=((Literal *)(local_50 + 1),(Literal *)&local_200.func);
      Literal::~Literal((Literal *)&local_200.func);
      curr->right = (Expression *)c2;
    }
    else {
      local_268.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            *)&c1;
      local_200.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_48;
      local_90 = (Expression *)&c2;
      local_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1e0 = 0;
      local_268.submatchers.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
            *)0x0;
      local_268.submatchers.next._8_8_ = 0;
      local_228.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
      local_228._8_4_ = 4;
      local_80._0_8_ =
           (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
            *)0x0;
      local_80._8_4_ = Sub;
      local_218 = &local_268;
      local_210 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                   *)&local_90;
      local_68 = &local_228;
      if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
            BinaryId) &&
          (BVar1 = curr->op, local_80._16_8_ = &local_200,
          BVar4 = Abstract::getBinary((Type)(curr->left->type).id,Sub), BVar1 == BVar4)) &&
         (bVar3 = Match::Internal::
                  Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                  ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                                *)(local_80 + 0x10)), bVar3)) {
        Literal::sub((Literal *)&local_200.func,(Literal *)(local_48.id + 0x10),&c1->value);
        Literal::operator=((Literal *)(local_50 + 1),(Literal *)&local_200.func);
        Literal::~Literal((Literal *)&local_200.func);
        curr->op = *(BinaryOp *)(&DAT_00b7bea8 + local_58 * 4);
        pEVar2 = curr->left;
        curr->left = (Expression *)c2;
        curr->right = pEVar2;
      }
      else {
        local_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e0 = 0;
        local_200.i64 = 0;
        local_268.submatchers.next.curr =
             (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)local_80;
        local_80._0_8_ =
             (matched_t<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>_>
              *)0x0;
        local_80._8_4_ = Neg;
        local_268.binder =
             (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
              *)0x0;
        local_268.data = DivS;
        local_268.submatchers.curr =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
              *)&local_200;
        local_228.binder = &local_90;
        local_80._16_8_ = &local_228;
        bVar3 = Match::Internal::
                Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                ::matches(&local_268,
                          (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                           )curr);
        pBVar6 = (Binary *)0x0;
        if (bVar3) {
          this_00 = (Literal *)(local_50 + 1);
          Literal::neg((Literal *)&local_200.func,this_00);
          Literal::operator=(this_00,(Literal *)&local_200.func);
          Literal::~Literal((Literal *)&local_200.func);
          curr->right = local_90;
          pBVar6 = curr;
        }
      }
    }
  }
  return (Expression *)pBVar6;
}

Assistant:

Expression* optimizeWithConstantOnLeft(Binary* curr) {
    using namespace Match;
    using namespace Abstract;

    auto type = curr->left->type;
    auto* left = curr->left->cast<Const>();
    // 0 <<>> x   ==>   0
    if (Abstract::hasAnyShift(curr->op) && left->value.isZero() &&
        !effects(curr->right).hasSideEffects()) {
      return curr->left;
    }
    // (signed)-1 >> x   ==>   -1
    // rotl(-1, x)       ==>   -1
    // rotr(-1, x)       ==>   -1
    if ((curr->op == Abstract::getBinary(type, ShrS) ||
         curr->op == Abstract::getBinary(type, RotL) ||
         curr->op == Abstract::getBinary(type, RotR)) &&
        left->value.getInteger() == -1LL &&
        !effects(curr->right).hasSideEffects()) {
      return curr->left;
    }
    {
      // C1 - (x + C2)  ==>  (C1 - C2) - x
      Const *c1, *c2;
      Expression* x;
      if (matches(curr,
                  binary(Sub, ival(&c1), binary(Add, any(&x), ival(&c2))))) {
        left->value = c1->value.sub(c2->value);
        curr->right = x;
        return curr;
      }
      // C1 - (C2 - x)  ==>   x + (C1 - C2)
      if (matches(curr,
                  binary(Sub, ival(&c1), binary(Sub, ival(&c2), any(&x))))) {
        left->value = c1->value.sub(c2->value);
        curr->op = Abstract::getBinary(type, Add);
        curr->right = x;
        std::swap(curr->left, curr->right);
        return curr;
      }
    }
    {
      // fval(C) / -x   ==>  -C / x
      Expression* right;
      if (matches(curr, binary(DivS, fval(), unary(Neg, any(&right))))) {
        left->value = left->value.neg();
        curr->right = right;
        return curr;
      }
    }
    return nullptr;
  }